

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_hmac.c
# Opt level: O0

int csp_hmac_verify(csp_packet_t *packet,_Bool include_header)

{
  byte in_SIL;
  long in_RDI;
  uint8_t hmac [20];
  uint8_t *in_stack_00000078;
  uint32_t in_stack_00000084;
  void *in_stack_00000088;
  uint32_t in_stack_00000094;
  void *in_stack_00000098;
  int local_28;
  int local_4;
  
  if (*(ushort *)(in_RDI + 0x20) < 4) {
    local_4 = -100;
  }
  else {
    if ((in_SIL & 1) == 0) {
      csp_hmac_memory(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000084,
                      in_stack_00000078);
      if (*(int *)(in_RDI + (ulong)*(ushort *)(in_RDI + 0x20) + 0x3c) != local_28) {
        return -100;
      }
      *(short *)(in_RDI + 0x20) = *(short *)(in_RDI + 0x20) + -4;
    }
    else {
      csp_hmac_memory(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000084,
                      in_stack_00000078);
      if (*(int *)(*(long *)(in_RDI + 0x10) + (ulong)*(ushort *)(in_RDI + 0x18) + -4) != local_28) {
        return -100;
      }
      *(short *)(in_RDI + 0x18) = *(short *)(in_RDI + 0x18) + -4;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int csp_hmac_verify(csp_packet_t * packet, bool include_header) {

	if (packet->length < (unsigned int)CSP_HMAC_LENGTH) {
		return CSP_ERR_HMAC;
	}

	uint8_t hmac[CSP_SHA1_DIGESTSIZE];

	/* Calculate HMAC */
	if (include_header) {

		csp_hmac_memory(csp_hmac_key, sizeof(csp_hmac_key), packet->frame_begin, packet->frame_length - CSP_HMAC_LENGTH, hmac);

		/* Compare calculated HMAC with packet header */
		if (memcmp(&packet->frame_begin[packet->frame_length] - CSP_HMAC_LENGTH, hmac, CSP_HMAC_LENGTH) != 0) {
			/* HMAC failed */
			return CSP_ERR_HMAC;
		}

		/* Strip HMAC */
		packet->frame_length -= CSP_HMAC_LENGTH;

	} else {
		csp_hmac_memory(csp_hmac_key, sizeof(csp_hmac_key), packet->data, packet->length - CSP_HMAC_LENGTH, hmac);

		/* Compare calculated HMAC with packet header */
		if (memcmp(&packet->data[packet->length] - CSP_HMAC_LENGTH, hmac, CSP_HMAC_LENGTH) != 0) {
			/* HMAC failed */
			return CSP_ERR_HMAC;
		}

		/* Strip HMAC */
		packet->length -= CSP_HMAC_LENGTH;
	}

	return CSP_ERR_NONE;
}